

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

CurrencyFormatInfoResult *
anon_unknown.dwarf_131980::getCurrencyFormatInfo
          (CurrencyFormatInfoResult *__return_storage_ptr__,Locale *locale,char *isoCode,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  UResourceBundle *pUVar4;
  UResourceBundle *pUVar5;
  UChar *pUVar6;
  StringPiece s;
  StringPiece s_00;
  int32_t local_a4;
  int32_t dummy;
  LocalUResourceBundlePointer bundle;
  undefined1 auStack_90 [4];
  UErrorCode localStatus;
  undefined4 local_88;
  undefined1 local_70 [12];
  undefined1 local_60 [8];
  CharString key;
  UErrorCode *status_local;
  char *isoCode_local;
  Locale *locale_local;
  
  key._56_8_ = status;
  memset(__return_storage_ptr__,0,0x20);
  UVar1 = ::U_FAILURE(*(UErrorCode *)key._56_8_);
  if (UVar1 != '\0') {
    return __return_storage_ptr__;
  }
  icu_63::CharString::CharString((CharString *)local_60);
  icu_63::StringPiece::StringPiece((StringPiece *)local_70,"Currencies/");
  s._12_4_ = 0;
  s.ptr_ = (char *)local_70._0_8_;
  s.length_ = local_70._8_4_;
  icu_63::CharString::append((CharString *)local_60,s,(UErrorCode *)key._56_8_);
  icu_63::StringPiece::StringPiece((StringPiece *)auStack_90,isoCode);
  s_00._12_4_ = 0;
  s_00.ptr_ = (char *)_auStack_90;
  s_00.length_ = local_88;
  icu_63::CharString::append((CharString *)local_60,s_00,(UErrorCode *)key._56_8_);
  bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ = *(UErrorCode *)key._56_8_;
  pcVar3 = icu_63::Locale::getName(locale);
  pUVar4 = ures_open_63("icudt63l-curr",pcVar3,
                        (UErrorCode *)
                        ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffff60,pUVar4);
  pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                     ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
  pcVar3 = icu_63::CharString::data((CharString *)local_60);
  pUVar5 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                     ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
  ures_getByKeyWithFallback_63
            (pUVar4,pcVar3,pUVar5,
             (UErrorCode *)((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
  UVar1 = ::U_SUCCESS(bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
  if (UVar1 != '\0') {
    pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
    iVar2 = ures_getSize_63(pUVar4);
    if (2 < iVar2) {
      pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
      pUVar5 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
      ures_getByIndex_63(pUVar4,2,pUVar5,
                         (UErrorCode *)
                         ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
      __return_storage_ptr__->exists = true;
      pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
      pUVar6 = ures_getStringByIndex_63
                         (pUVar4,0,&local_a4,
                          (UErrorCode *)
                          ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
      __return_storage_ptr__->pattern = pUVar6;
      pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
      pUVar6 = ures_getStringByIndex_63
                         (pUVar4,1,&local_a4,
                          (UErrorCode *)
                          ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
      __return_storage_ptr__->decimalSeparator = pUVar6;
      pUVar4 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffff60);
      pUVar6 = ures_getStringByIndex_63
                         (pUVar4,2,&local_a4,
                          (UErrorCode *)
                          ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
      __return_storage_ptr__->groupingSeparator = pUVar6;
      *(UErrorCode *)key._56_8_ = bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_;
      goto LAB_002e1890;
    }
  }
  if (bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ != U_MISSING_RESOURCE_ERROR) {
    *(UErrorCode *)key._56_8_ = bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_;
  }
LAB_002e1890:
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffff60);
  icu_63::CharString::~CharString((CharString *)local_60);
  return __return_storage_ptr__;
}

Assistant:

CurrencyFormatInfoResult
getCurrencyFormatInfo(const Locale& locale, const char* isoCode, UErrorCode& status) {
    // TODO: Load this data in a centralized location like ICU4J?
    // TODO: Move this into the CurrencySymbols class?
    // TODO: Parts of this same data are loaded in dcfmtsym.cpp; should clean up.
    CurrencyFormatInfoResult result = {false, nullptr, nullptr, nullptr};
    if (U_FAILURE(status)) { return result; }
    CharString key;
    key.append("Currencies/", status);
    key.append(isoCode, status);
    UErrorCode localStatus = status;
    LocalUResourceBundlePointer bundle(ures_open(U_ICUDATA_CURR, locale.getName(), &localStatus));
    ures_getByKeyWithFallback(bundle.getAlias(), key.data(), bundle.getAlias(), &localStatus);
    if (U_SUCCESS(localStatus) &&
        ures_getSize(bundle.getAlias()) > 2) { // the length is 3 if more data is present
        ures_getByIndex(bundle.getAlias(), 2, bundle.getAlias(), &localStatus);
        int32_t dummy;
        result.exists = true;
        result.pattern = ures_getStringByIndex(bundle.getAlias(), 0, &dummy, &localStatus);
        result.decimalSeparator = ures_getStringByIndex(bundle.getAlias(), 1, &dummy, &localStatus);
        result.groupingSeparator = ures_getStringByIndex(bundle.getAlias(), 2, &dummy, &localStatus);
        status = localStatus;
    } else if (localStatus != U_MISSING_RESOURCE_ERROR) {
        status = localStatus;
    }
    return result;
}